

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_hex_to_byte_array(char *h,uint8_t *dest,int max)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    iVar3 = (int)lVar4;
    if (max == iVar3) {
      return -1;
    }
    if (h[lVar4 * 2] == '\0') {
      if (0 < max - iVar3) {
        return iVar3;
      }
      return -1;
    }
    cVar1 = char_to_hex(h[lVar4 * 2]);
    if (h[lVar4 * 2 + 1] == '\0') {
      return -1;
    }
    if (cVar1 < '\0') break;
    bVar2 = char_to_hex(h[lVar4 * 2 + 1]);
    if ((char)bVar2 < '\0') {
      return -1;
    }
    dest[lVar4] = bVar2 | cVar1 << 4;
    lVar4 = lVar4 + 1;
  }
  return -1;
}

Assistant:

int
lws_hex_to_byte_array(const char *h, uint8_t *dest, int max)
{
	uint8_t *odest = dest;

	while (max-- && *h) {
		int t = char_to_hex(*h++), t1;

		if (!*h || t < 0)
			return -1;

		t1 = char_to_hex(*h++);
		if (t1 < 0)
			return -1;

		*dest++ = (t << 4) | t1;
	}

	if (max < 0)
		return -1;

	return lws_ptr_diff(dest, odest);
}